

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace_impl.cc
# Opt level: O0

int32_t __thiscall
webrtc::TraceImpl::SetTraceFileImpl(TraceImpl *this,char *file_name_utf8,bool add_file_counter)

{
  int iVar1;
  element_type *peVar2;
  char local_448 [8];
  char file_name_with_counter_utf8 [1024];
  CritScope local_30;
  CritScope lock;
  bool add_file_counter_local;
  char *file_name_utf8_local;
  TraceImpl *this_local;
  
  lock.cs_._7_1_ = add_file_counter;
  rtc::CritScope::CritScope(&local_30,&this->crit_);
  peVar2 = rtc::scoped_ptr<webrtc::FileWrapper,_rtc::DefaultDeleter<webrtc::FileWrapper>_>::
           operator->(&this->trace_file_);
  (*(peVar2->super_InStream)._vptr_InStream[9])();
  peVar2 = rtc::scoped_ptr<webrtc::FileWrapper,_rtc::DefaultDeleter<webrtc::FileWrapper>_>::
           operator->(&this->trace_file_);
  (*(peVar2->super_InStream)._vptr_InStream[7])();
  if (file_name_utf8 != (char *)0x0) {
    if ((lock.cs_._7_1_ & 1) == 0) {
      this->file_count_text_ = 0;
      peVar2 = rtc::scoped_ptr<webrtc::FileWrapper,_rtc::DefaultDeleter<webrtc::FileWrapper>_>::
               operator->(&this->trace_file_);
      iVar1 = (*(peVar2->super_InStream)._vptr_InStream[5])(peVar2,file_name_utf8,0,0,1);
      if (iVar1 == -1) {
        this_local._4_4_ = -1;
        goto LAB_002804d6;
      }
    }
    else {
      this->file_count_text_ = 1;
      CreateFileName(this,file_name_utf8,local_448,this->file_count_text_);
      peVar2 = rtc::scoped_ptr<webrtc::FileWrapper,_rtc::DefaultDeleter<webrtc::FileWrapper>_>::
               operator->(&this->trace_file_);
      iVar1 = (*(peVar2->super_InStream)._vptr_InStream[5])(peVar2,local_448,0,0,1);
      if (iVar1 == -1) {
        this_local._4_4_ = -1;
        goto LAB_002804d6;
      }
    }
  }
  this->row_count_text_ = 0;
  this_local._4_4_ = 0;
LAB_002804d6:
  rtc::CritScope::~CritScope(&local_30);
  return this_local._4_4_;
}

Assistant:

int32_t TraceImpl::SetTraceFileImpl(const char* file_name_utf8,
                                    const bool add_file_counter) {
  rtc::CritScope lock(&crit_);

  trace_file_->Flush();
  trace_file_->CloseFile();

  if (file_name_utf8) {
    if (add_file_counter) {
      file_count_text_ = 1;

      char file_name_with_counter_utf8[FileWrapper::kMaxFileNameSize];
      CreateFileName(file_name_utf8, file_name_with_counter_utf8,
                     file_count_text_);
      if (trace_file_->OpenFile(file_name_with_counter_utf8, false, false,
                               true) == -1) {
        return -1;
      }
    } else {
      file_count_text_ = 0;
      if (trace_file_->OpenFile(file_name_utf8, false, false, true) == -1) {
        return -1;
      }
    }
  }
  row_count_text_ = 0;
  return 0;
}